

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Point3<pbrt::Interval<float>_> * __thiscall
pbrt::Tuple3<pbrt::Point3,pbrt::Interval<float>>::operator/
          (Tuple3<pbrt::Point3,_pbrt::Interval<float>_> *this,float d)

{
  Interval<float> y;
  long in_RSI;
  Interval<float> in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  float f;
  Interval<float> z;
  Interval<float> x;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  f = in_RDI.high;
  auVar1._0_8_ = pbrt::operator/(in_RDI,f);
  auVar1._8_56_ = extraout_var;
  vmovlpd_avx(auVar1._0_16_);
  x = *(Interval<float> *)(in_RSI + 8);
  auVar2._0_8_ = pbrt::operator/(in_RDI,f);
  auVar2._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar2._0_16_);
  z = *(Interval<float> *)(in_RSI + 0x10);
  auVar3._0_8_ = pbrt::operator/(in_RDI,f);
  auVar3._8_56_ = extraout_var_01;
  y = (Interval<float>)vmovlpd_avx(auVar3._0_16_);
  Point3<pbrt::Interval<float>_>::Point3((Point3<pbrt::Interval<float>_> *)in_RDI,x,y,z);
  return (Point3<pbrt::Interval<float>_> *)in_RDI;
}

Assistant:

PBRT_CPU_GPU auto operator/(U d) const -> Child<decltype(T{} / U{})> {
        DCHECK_NE(d, 0);
        return {x / d, y / d, z / d};
    }